

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDFace *f,ON_SubDFaceParameter fp)

{
  ON_SubDFaceCornerDex OVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_2dPoint OVar5;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_48;
  anon_union_8_3_7b68a318_for_m_p1 aStack_40;
  ON_SubDComponentId local_38;
  ON_SubDComponentId local_30;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  ON_SubDComponentId::ON_SubDComponentId(&local_30,f);
  bVar2 = Internal_Init(this,local_30);
  if (bVar2) {
    bVar2 = ON_SubDFaceParameter::IsSet(&fp);
    OVar1 = fp.m_cdex;
    if (bVar2) {
      uVar4 = (uint)fp.m_cdex >> 0x10;
      if (0x2ffff < (uint)fp.m_cdex && fp.m_cdex.m_corner_index < fp.m_cdex.m_edge_count) {
        uVar3 = ON_SubDFace::EdgeCount(f);
        if (uVar4 == uVar3) {
          OVar5 = ON_SubDFaceParameter::FaceCornerParameters(&fp);
          aStack_40 = (anon_union_8_3_7b68a318_for_m_p1)OVar5.y;
          local_48 = (anon_union_8_3_6bf0bb0e_for_m_p0)OVar5.x;
          bVar2 = ON_2dPoint::IsValid((ON_2dPoint *)&local_48.v_active_e);
          if (bVar2) {
            ON_SubDComponentId::ON_SubDComponentId(&local_38,f,(uint)OVar1 & 0xffff);
            this->m_cid = local_38;
            this->m_p0 = local_48;
            this->m_p1 = aStack_40;
          }
        }
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDFace* f,
  ON_SubDFaceParameter fp
)
{
  if (Internal_Init(ON_SubDComponentId(f)) && fp.IsSet())
  {
    const ON_SubDFaceCornerDex cdex = fp.FaceCornerDex();
    if (cdex.IsSet() && cdex.EdgeCount() == f->EdgeCount())
    {
      const ON_2dPoint p = fp.FaceCornerParameters();
      if (p.IsValid())
      {
        this->m_cid = ON_SubDComponentId(f, cdex.CornerIndex());
        this->m_p0.f_corner_s = p.x;
        this->m_p1.f_corner_t = p.y;
      }
    }
  }
}